

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrderQty * __thiscall Application::queryOrderQty(OrderQty *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  double local_28;
  long local_20;
  long value;
  Application *this_local;
  
  value = (long)this;
  this_local = (Application *)__return_storage_ptr__;
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"OrderQty: ");
  std::istream::operator>>(&std::cin,&local_20);
  local_28 = (double)local_20;
  FIX::OrderQty::OrderQty(__return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

FIX::OrderQty Application::queryOrderQty() {
  long value;
  std::cout << std::endl << "OrderQty: ";
  std::cin >> value;
  return FIX::OrderQty(value);
}